

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose
          (ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *this)

{
  SocketAddress *pSVar1;
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar2;
  SocketAddress *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (SocketAddress *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (SocketAddress *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    this->endPtr = (SocketAddress *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x88,((long)pRVar2 - (long)pSVar1) / 0x88,
               ((long)pSVar3 - (long)pSVar1) / 0x88,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }